

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

int __thiscall leveldb::DBTest::NumTableFilesAtLevel(DBTest *this,int level)

{
  DB *pDVar1;
  int iVar2;
  leveldb local_238 [32];
  string local_218 [32];
  Slice local_1f8 [2];
  Tester local_1d8;
  string local_38 [8];
  string property;
  int level_local;
  DBTest *this_local;
  
  std::__cxx11::string::string(local_38);
  test::Tester::Tester
            (&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x196);
  pDVar1 = this->db_;
  NumberToString_abi_cxx11_(local_238,(long)level);
  std::operator+((char *)local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "leveldb.num-files-at-level");
  Slice::Slice(local_1f8,local_218);
  iVar2 = (*pDVar1->_vptr_DB[9])(pDVar1,local_1f8,local_38);
  test::Tester::Is(&local_1d8,(bool)((byte)iVar2 & 1),
                   "db_->GetProperty( \"leveldb.num-files-at-level\" + NumberToString(level), &property)"
                  );
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)local_238);
  test::Tester::~Tester(&local_1d8);
  iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_38);
  return iVar2;
}

Assistant:

int NumTableFilesAtLevel(int level) {
    std::string property;
    ASSERT_TRUE(db_->GetProperty(
        "leveldb.num-files-at-level" + NumberToString(level), &property));
    return std::stoi(property);
  }